

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O2

void __thiscall
AnalyserUnits_trigonometricOperators_Test::TestBody(AnalyserUnits_trigonometricOperators_Test *this)

{
  long lVar1;
  char *pcVar2;
  pointer __rhs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator<char> local_51a;
  allocator_type local_519;
  allocator<char> local_518;
  allocator<char> local_517;
  allocator<char> local_516;
  allocator<char> local_515;
  allocator<char> local_514;
  allocator<char> local_513;
  allocator<char> local_512;
  allocator<char> local_511;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  ScopedTrace gtest_trace_588;
  ParserPtr parser;
  ModelPtr model;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  operators;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  AnalyserPtr analyser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"sin",(allocator<char> *)&local_510);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"cos",(allocator<char> *)&gtest_trace_588);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"tan",(allocator<char> *)&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"sec",(allocator<char> *)&local_370);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"csc",(allocator<char> *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"cot",(allocator<char> *)&local_3b0);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"sinh",(allocator<char> *)&local_3d0)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_250,"cosh",(allocator<char> *)&local_3f0)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_230,"tanh",(allocator<char> *)&local_410)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_210,"sech",(allocator<char> *)&local_430)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"csch",(allocator<char> *)&local_450)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"coth",(allocator<char> *)&local_470)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b0,"arcsin",(allocator<char> *)&expectedIssues);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"arccos",(allocator<char> *)&parser);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"arctan",(allocator<char> *)&model);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"arcsec",&local_51a);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"arccsc",&local_511);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"arccot",&local_512);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"arcsinh",&local_513);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"arccosh",&local_514);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"arctanh",&local_515);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"arcsech",&local_516);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"arccsch",&local_517);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"arccoth",&local_518);
  __l._M_len = 0x18;
  __l._M_array = (iterator)&analyser;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&operators,__l,&local_519);
  lVar1 = 0x2e0;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  local_4f0 = &local_2f0;
  for (__rhs = operators.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __rhs != operators.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
    libcellml::Parser::create(SUB81(&parser,0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_trace_588,"analyser/units/",__rhs);
    std::operator+(&local_510,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_trace_588,".cellml");
    fileContents((string *)&analyser);
    libcellml::Parser::parseModel((string *)&model);
    std::__cxx11::string::~string((string *)&analyser);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&gtest_trace_588);
    local_510._M_dataplus._M_p = (pointer)0x0;
    _gtest_trace_588 = (pointer)libcellml::Logger::issueCount();
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&analyser,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_510,
               (unsigned_long *)&gtest_trace_588);
    if ((char)analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        '\0') {
      testing::Message::Message((Message *)&local_510);
      pcVar2 = "";
      if (analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pcVar2 = *(char **)analyser.
                           super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_trace_588,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
                 ,0x23f,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_trace_588,(Message *)&local_510);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_trace_588);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_510);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
    std::operator+(&local_350,"The unit of \'3.0\' in \'",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_trace_588,&local_350,"(3.0)\' in equation \'b = ");
    std::operator+(&local_510,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_trace_588,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&analyser,
                   &local_510,
                   "(3.0)\' in component \'main\' is not dimensionless. \'3.0\' is in \'second\'.");
    std::operator+(&local_3b0,"The unit of \'5.0\' in \'",__rhs);
    std::operator+(&local_390,&local_3b0,"(5.0)\' in equation \'c = ");
    std::operator+(&local_370,&local_390,__rhs);
    std::operator+(&local_310,&local_370,
                   "(5.0)\' in component \'main\' is not dimensionless. \'5.0\' is in \'volt\' (i.e. \'ampere^-1 x kilogram x metre^2 x second^-3\')."
                  );
    std::operator+(&local_410,"The unit of \'7.0\' in \'",__rhs);
    std::operator+(&local_3f0,&local_410,"(7.0)\' in equation \'d = ");
    std::operator+(&local_3d0,&local_3f0,__rhs);
    std::operator+(&local_2f0,&local_3d0,
                   "(7.0)\' in component \'main\' is not dimensionless. \'7.0\' is in \'frog\'.");
    std::operator+(&local_470,"The unit of \'9.0\' in \'",__rhs);
    std::operator+(&local_450,&local_470,"(9.0)\' in equation \'e = ");
    std::operator+(&local_430,&local_450,__rhs);
    std::operator+(&local_2d0,&local_430,
                   "(9.0)\' in component \'main\' is not dimensionless. \'9.0\' is in \'imaginary\' (i.e. \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\')."
                  );
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)&analyser;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&expectedIssues,__l_00,(allocator_type *)&local_51a);
    lVar1 = 0x60;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&analyser.
                         super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 + lVar1));
      lVar1 = lVar1 + -0x20;
    } while (lVar1 != -0x20);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&gtest_trace_588);
    std::__cxx11::string::~string((string *)&local_350);
    libcellml::Analyser::create();
    libcellml::Analyser::analyseModel
              ((shared_ptr *)
               CONCAT71(analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._1_7_,
                        (char)analyser.
                              super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr));
    testing::ScopedTrace::ScopedTrace
              (&gtest_trace_588,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x24c,"Issue occurred here.");
    std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Analyser,void>
              ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)&local_510,
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>);
    expectEqualIssues((vector *)&expectedIssues,(shared_ptr *)&local_510);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_510._M_string_length);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_588);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&expectedIssues);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&operators);
  return;
}

Assistant:

TEST(AnalyserUnits, trigonometricOperators)
{
    std::vector<std::string> operators = {"sin", "cos", "tan", "sec", "csc", "cot", "sinh", "cosh", "tanh", "sech", "csch", "coth", "arcsin", "arccos", "arctan", "arcsec", "arccsc", "arccot", "arcsinh", "arccosh", "arctanh", "arcsech", "arccsch", "arccoth"};

    for (const auto &op : operators) {
        auto parser = libcellml::Parser::create();
        auto model = parser->parseModel(fileContents("analyser/units/" + op + ".cellml"));

        EXPECT_EQ(size_t(0), parser->issueCount());

        const std::vector<std::string> expectedIssues = {
            "The unit of '3.0' in '" + op + "(3.0)' in equation 'b = " + op + "(3.0)' in component 'main' is not dimensionless. '3.0' is in 'second'.",
            "The unit of '5.0' in '" + op + "(5.0)' in equation 'c = " + op + "(5.0)' in component 'main' is not dimensionless. '5.0' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3').",
            "The unit of '7.0' in '" + op + "(7.0)' in equation 'd = " + op + "(7.0)' in component 'main' is not dimensionless. '7.0' is in 'frog'.",
            "The unit of '9.0' in '" + op + "(9.0)' in equation 'e = " + op + "(9.0)' in component 'main' is not dimensionless. '9.0' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
        };

        auto analyser = libcellml::Analyser::create();

        analyser->analyseModel(model);

        EXPECT_EQ_ISSUES(expectedIssues, analyser);
    }
}